

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCaseInstance::computeFragmentReference
          (ShaderRenderCaseInstance *this,Surface *result,QuadGrid *quadGrid)

{
  int iVar1;
  int iVar2;
  Vec4 *local_2e0;
  RGBA local_2d0;
  undefined1 local_2cc [8];
  Vec4 color;
  float sy;
  float sx;
  int x;
  int y;
  ShaderEvalContext evalCtx;
  bool hasAlpha;
  int height;
  int width;
  QuadGrid *quadGrid_local;
  Surface *result_local;
  ShaderRenderCaseInstance *this_local;
  
  iVar1 = tcu::Surface::getWidth(result);
  iVar2 = tcu::Surface::getHeight(result);
  evalCtx.m_quadGrid._7_1_ = 1;
  ShaderEvalContext::ShaderEvalContext((ShaderEvalContext *)&x,quadGrid);
  for (sx = 0.0; (int)sx < iVar2; sx = (float)((int)sx + 1)) {
    for (sy = 0.0; (int)sy < iVar1; sy = (float)((int)sy + 1)) {
      ShaderEvalContext::reset
                ((ShaderEvalContext *)&x,((float)(int)sy + 0.5) / (float)iVar1,
                 ((float)(int)sx + 0.5) / (float)iVar2);
      (*this->m_evaluator->_vptr_ShaderEvaluator[2])(this->m_evaluator,&x);
      if ((evalCtx.color.m_data[2]._0_1_ & 1) == 0) {
        local_2e0 = (Vec4 *)&evalCtx.textures[3].texCubeArray;
      }
      else {
        local_2e0 = &this->m_clearColor;
      }
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_2cc,local_2e0);
      tcu::RGBA::RGBA(&local_2d0,(Vec4 *)local_2cc);
      tcu::Surface::setPixel(result,(int)sy,(int)sx,local_2d0);
    }
  }
  ShaderEvalContext::~ShaderEvalContext((ShaderEvalContext *)&x);
  return;
}

Assistant:

void ShaderRenderCaseInstance::computeFragmentReference (tcu::Surface& result, const QuadGrid& quadGrid)
{
	DE_ASSERT(m_evaluator);

	// Buffer info.
	const int			width		= result.getWidth();
	const int			height		= result.getHeight();
	const bool			hasAlpha	= true;  // \todo [2015-09-07 elecro] add correct alpha check
	ShaderEvalContext	evalCtx		(quadGrid);

	// Render.
	for (int y = 0; y < height; y++)
	for (int x = 0; x < width; x++)
	{
		const float sx = ((float)x + 0.5f) / (float)width;
		const float sy = ((float)y + 0.5f) / (float)height;

		evalCtx.reset(sx, sy);
		m_evaluator->evaluate(evalCtx);
		// Select either clear color or computed color based on discarded bit.
		tcu::Vec4 color = evalCtx.isDiscarded ? m_clearColor : evalCtx.color;

		if (!hasAlpha)
			color.w() = 1.0f;

		result.setPixel(x, y, tcu::RGBA(color));
	}
}